

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam000000000018d390 = 0x2d2d2d2d2d2d2d;
    uRam000000000018d397 = 0x2d2d2d2d2d2d2d2d;
    _DAT_0018d380 = 0x2d2d2d2d2d2d2d2d;
    uRam000000000018d388 = 0x2d2d2d2d2d2d2d;
    DAT_0018d38f = 0x2d;
    _DAT_0018d370 = 0x2d2d2d2d2d2d2d2d;
    uRam000000000018d378 = 0x2d2d2d2d2d2d2d2d;
    _DAT_0018d360 = 0x2d2d2d2d2d2d2d2d;
    uRam000000000018d368 = 0x2d2d2d2d2d2d2d2d;
    _line = 0x2d2d2d2d2d2d2d2d;
    uRam000000000018d358 = 0x2d2d2d2d2d2d2d2d;
    DAT_0018d39f = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void ConsoleReporter::printSummaryDivider() {
    stream << getLineOfChars<'-'>() << '\n';
}